

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cfg.cpp
# Opt level: O2

bool __thiscall
diligent_spirv_cross::CFG::node_terminates_control_flow_in_sub_graph
          (CFG *this,BlockID from,BlockID to)

{
  uint32_t uVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  bool bVar5;
  bool bVar6;
  Merge MVar7;
  SPIRBlock *pSVar8;
  const_iterator cVar9;
  SPIRBlock *pSVar10;
  SPIRBlock *to_00;
  uint32_t uVar11;
  long lVar12;
  bool bVar13;
  DominatorBuilder builder;
  uint32_t local_68;
  DominatorBuilder local_50;
  SPIRBlock *local_40;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_diligent_spirv_cross::SmallVector<unsigned_int,_8UL>_>,_std::allocator<std::pair<const_unsigned_int,_diligent_spirv_cross::SmallVector<unsigned_int,_8UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *local_38;
  
  pSVar8 = Compiler::get<diligent_spirv_cross::SPIRBlock>(this->compiler,from.id);
  local_68 = 0;
  if (pSVar8->merge == MergeLoop) {
    local_68 = (pSVar8->merge_block).id;
  }
  local_38 = &(this->preceding_edges)._M_h;
LAB_006a4aa9:
  uVar11 = to.id;
  if (uVar11 == from.id) goto LAB_006a4c5e;
  local_50.cfg = (CFG *)CONCAT44(local_50.cfg._4_4_,uVar11);
  cVar9 = ::std::
          _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_diligent_spirv_cross::SmallVector<unsigned_int,_8UL>_>,_std::allocator<std::pair<const_unsigned_int,_diligent_spirv_cross::SmallVector<unsigned_int,_8UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(local_38,(key_type_conflict *)&local_50);
  if (cVar9.
      super__Node_iterator_base<std::pair<const_unsigned_int,_diligent_spirv_cross::SmallVector<unsigned_int,_8UL>_>,_false>
      ._M_cur == (__node_type *)0x0) goto LAB_006a4c5e;
  local_50.dominator = 0;
  lVar3 = *(long *)((long)cVar9.
                          super__Node_iterator_base<std::pair<const_unsigned_int,_diligent_spirv_cross::SmallVector<unsigned_int,_8UL>_>,_false>
                          ._M_cur + 0x10);
  lVar4 = *(long *)((long)cVar9.
                          super__Node_iterator_base<std::pair<const_unsigned_int,_diligent_spirv_cross::SmallVector<unsigned_int,_8UL>_>,_false>
                          ._M_cur + 0x18);
  local_50.cfg = this;
  for (lVar12 = 0; to.id = local_50.dominator, lVar4 << 2 != lVar12; lVar12 = lVar12 + 4) {
    DominatorBuilder::add_block(&local_50,*(uint32_t *)(lVar3 + lVar12));
  }
  if (local_50.dominator == 0) goto LAB_006a4c5e;
  pSVar8 = Compiler::get<diligent_spirv_cross::SPIRBlock>(this->compiler,local_50.dominator);
  MVar7 = pSVar8->merge;
  if (MVar7 == MergeNone) {
LAB_006a4b87:
    bVar6 = true;
    if (local_68 == 0) {
      bVar5 = true;
    }
    else {
      bVar5 = true;
      if (*(int *)&(pSVar8->super_IVariant).field_0xc == 2) {
        pSVar10 = Compiler::get<diligent_spirv_cross::SPIRBlock>
                            (this->compiler,(pSVar8->true_block).id);
        local_40 = Compiler::get<diligent_spirv_cross::SPIRBlock>
                             (this->compiler,(pSVar8->false_block).id);
        to_00 = Compiler::get<diligent_spirv_cross::SPIRBlock>(this->compiler,local_68);
        bVar5 = Compiler::execution_is_branchless(this->compiler,pSVar10,to_00);
        bVar6 = Compiler::execution_is_branchless(this->compiler,local_40,to_00);
        bVar6 = !bVar6;
        bVar5 = !bVar5;
      }
    }
  }
  else {
    if (MVar7 == MergeSelection) {
      uVar1 = (pSVar8->next_block).id;
      if (uVar1 != 0) {
        pSVar10 = Compiler::get<diligent_spirv_cross::SPIRBlock>(this->compiler,uVar1);
        if (*(int *)&(pSVar10->super_IVariant).field_0xc == 5) goto LAB_006a4b87;
        MVar7 = pSVar8->merge;
        goto LAB_006a4b4f;
      }
LAB_006a4b72:
      bVar13 = false;
    }
    else {
LAB_006a4b4f:
      if ((MVar7 != MergeLoop) || (uVar1 = (pSVar8->merge_block).id, uVar1 == 0)) goto LAB_006a4b72;
      pSVar10 = Compiler::get<diligent_spirv_cross::SPIRBlock>(this->compiler,uVar1);
      bVar13 = *(int *)&(pSVar10->super_IVariant).field_0xc == 5;
    }
    if ((pSVar8->super_IVariant).self.id == from.id) goto LAB_006a4b87;
    bVar6 = true;
    bVar5 = true;
    if (bVar13) goto LAB_006a4b87;
  }
  if (pSVar8->merge == MergeLoop) {
    uVar1 = (pSVar8->merge_block).id;
joined_r0x006a4c1d:
    if (uVar1 == uVar11) goto LAB_006a4aa9;
  }
  else if (pSVar8->merge == MergeSelection) {
    uVar1 = (pSVar8->next_block).id;
    goto joined_r0x006a4c1d;
  }
  iVar2 = *(int *)&(pSVar8->super_IVariant).field_0xc;
  if (iVar2 == 2) {
    if ((!(bool)(~bVar6 & (pSVar8->true_block).id == uVar11)) &&
       (bVar5 || (pSVar8->false_block).id != uVar11)) {
LAB_006a4c5e:
      return uVar11 == from.id;
    }
  }
  else if ((iVar2 != 1) || ((pSVar8->next_block).id != uVar11)) goto LAB_006a4c5e;
  goto LAB_006a4aa9;
}

Assistant:

bool CFG::node_terminates_control_flow_in_sub_graph(BlockID from, BlockID to) const
{
	// Walk backwards, starting from "to" block.
	// Only follow pred edges if they have a 1:1 relationship, or a merge relationship.
	// If we cannot find a path to "from", we must assume that to is inside control flow in some way.

	auto &from_block = compiler.get<SPIRBlock>(from);
	BlockID ignore_block_id = 0;
	if (from_block.merge == SPIRBlock::MergeLoop)
		ignore_block_id = from_block.merge_block;

	while (to != from)
	{
		auto pred_itr = preceding_edges.find(to);
		if (pred_itr == end(preceding_edges))
			return false;

		DominatorBuilder builder(*this);
		for (auto &edge : pred_itr->second)
			builder.add_block(edge);

		uint32_t dominator = builder.get_dominator();
		if (dominator == 0)
			return false;

		auto &dom = compiler.get<SPIRBlock>(dominator);

		bool true_path_ignore = false;
		bool false_path_ignore = false;

		bool merges_to_nothing = dom.merge == SPIRBlock::MergeNone ||
		                         (dom.merge == SPIRBlock::MergeSelection && dom.next_block &&
		                          compiler.get<SPIRBlock>(dom.next_block).terminator == SPIRBlock::Unreachable) ||
		                         (dom.merge == SPIRBlock::MergeLoop && dom.merge_block &&
		                          compiler.get<SPIRBlock>(dom.merge_block).terminator == SPIRBlock::Unreachable);

		if (dom.self == from || merges_to_nothing)
		{
			// We can only ignore inner branchy paths if there is no merge,
			// i.e. no code is generated afterwards. E.g. this allows us to elide continue:
			// for (;;) { if (cond) { continue; } else { break; } }.
			// Codegen here in SPIR-V will be something like either no merge if one path directly breaks, or
			// we merge to Unreachable.
			if (ignore_block_id && dom.terminator == SPIRBlock::Select)
			{
				auto &true_block = compiler.get<SPIRBlock>(dom.true_block);
				auto &false_block = compiler.get<SPIRBlock>(dom.false_block);
				auto &ignore_block = compiler.get<SPIRBlock>(ignore_block_id);
				true_path_ignore = compiler.execution_is_branchless(true_block, ignore_block);
				false_path_ignore = compiler.execution_is_branchless(false_block, ignore_block);
			}
		}

		// Cases where we allow traversal. This serves as a proxy for post-dominance in a loop body.
		// TODO: Might want to do full post-dominance analysis, but it's a lot of churn for something like this ...
		// - We're the merge block of a selection construct. Jump to header.
		// - We're the merge block of a loop. Jump to header.
		// - Direct branch. Trivial.
		// - Allow cases inside a branch if the header cannot merge execution before loop exit.
		if ((dom.merge == SPIRBlock::MergeSelection && dom.next_block == to) ||
		    (dom.merge == SPIRBlock::MergeLoop && dom.merge_block == to) ||
		    (dom.terminator == SPIRBlock::Direct && dom.next_block == to) ||
		    (dom.terminator == SPIRBlock::Select && dom.true_block == to && false_path_ignore) ||
		    (dom.terminator == SPIRBlock::Select && dom.false_block == to && true_path_ignore))
		{
			// Allow walking selection constructs if the other branch reaches out of a loop construct.
			// It cannot be in-scope anymore.
			to = dominator;
		}
		else
			return false;
	}

	return true;
}